

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode Curl_ssl_setup_x509_store(Curl_cfilter *cf,Curl_easy *data,SSL_CTX *ssl_ctx)

{
  byte bVar1;
  curl_blob *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  ssl_primary_config *psVar8;
  ssl_config_data *psVar9;
  timediff_t tVar10;
  X509_STORE *pXVar11;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  multi_ssl_backend_data *pmVar12;
  char *pcVar13;
  BIO *bp;
  stack_st_X509_INFO *psVar14;
  undefined8 *puVar15;
  long lVar16;
  char *pcVar17;
  int iVar18;
  byte bVar19;
  char *pcVar20;
  Curl_multi *pCVar21;
  curltime cVar22;
  curltime older;
  curltime newer;
  CURLcode local_54;
  
  psVar8 = Curl_ssl_cf_get_primary_config(cf);
  psVar9 = Curl_ssl_cf_get_config(cf,data);
  bVar19 = 1;
  if (((((data->set).general_ssl.ca_cache_timeout != 0) && ((psVar8->field_0x69 & 1) != 0)) &&
      (psVar8->CApath == (char *)0x0)) &&
     ((psVar8->ca_info_blob == (curl_blob *)0x0 && ((psVar9->primary).CRLfile == (char *)0x0)))) {
    bVar19 = (psVar9->field_0xb0 & 0x40) >> 6;
  }
  pCVar21 = data->multi_easy;
  if (((pCVar21 != (Curl_multi *)0x0) || (pCVar21 = data->multi, pCVar21 != (Curl_multi *)0x0)) &&
     ((pmVar12 = pCVar21->ssl_backend_data, pmVar12 != (multi_ssl_backend_data *)0x0 &&
      (pmVar12->store != (X509_STORE *)0x0)))) {
    cVar22 = Curl_now();
    uVar4 = (pmVar12->time).tv_sec;
    uVar5 = (pmVar12->time).tv_usec;
    older.tv_usec = uVar5;
    older.tv_sec = uVar4;
    older._12_4_ = 0;
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar22._0_12_,0);
    newer.tv_usec = SUB124(cVar22._0_12_,8);
    tVar10 = Curl_timediff(newer,older);
    lVar16 = (long)(data->set).general_ssl.ca_cache_timeout;
    if ((lVar16 < 0) || (SBORROW8(tVar10,lVar16 * 1000) != tVar10 + lVar16 * -1000 < 0)) {
      pmVar12 = pCVar21->ssl_backend_data;
      psVar8 = Curl_ssl_cf_get_primary_config(cf);
      pcVar13 = pmVar12->CAfile;
      pcVar3 = psVar8->CAfile;
      if (pcVar13 == (char *)0x0) {
        if (pcVar3 == (char *)0x0) {
LAB_00528968:
          pXVar11 = (X509_STORE *)pCVar21->ssl_backend_data->store;
          if ((pXVar11 != (X509_STORE *)0x0 && bVar19 == 0) &&
             (iVar6 = X509_STORE_up_ref(pXVar11), iVar6 != 0)) {
            SSL_CTX_set_cert_store((SSL_CTX *)ssl_ctx,pXVar11);
            return CURLE_OK;
          }
        }
      }
      else if ((pcVar3 != (char *)0x0) && (iVar6 = strcmp(pcVar13,pcVar3), iVar6 == 0))
      goto LAB_00528968;
    }
  }
  pXVar11 = SSL_CTX_get_cert_store((SSL_CTX *)ssl_ctx);
  psVar8 = Curl_ssl_cf_get_primary_config(cf);
  psVar9 = Curl_ssl_cf_get_config(cf,data);
  pcVar2 = psVar8->ca_info_blob;
  if (pcVar2 == (curl_blob *)0x0) {
    pcVar13 = psVar8->CAfile;
  }
  else {
    pcVar13 = (char *)0x0;
  }
  pcVar3 = psVar8->CApath;
  pcVar20 = (psVar9->primary).CRLfile;
  bVar1 = psVar8->field_0x69;
  if (((cf != (Curl_cfilter *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
     (0 < cf->cft->log_level)) {
    pcVar17 = "none";
    if (pcVar13 != (char *)0x0) {
      pcVar17 = pcVar13;
    }
    Curl_trc_cf_infof(data,cf,"populate_x509_store, path=%s, blob=%d",pcVar17,
                      (ulong)(pcVar2 != (curl_blob *)0x0));
  }
  if (pXVar11 == (X509_STORE *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if ((bVar1 & 1) != 0) {
    if (pcVar2 != (curl_blob *)0x0) {
      local_54 = CURLE_SSL_CACERT_BADFILE;
      if (0x7fffffff < pcVar2->len) {
LAB_00528b42:
        Curl_failf(data,"error importing CA certificate blob");
        return local_54;
      }
      bp = BIO_new_mem_buf(pcVar2->data,(int)pcVar2->len);
      if (bp == (BIO *)0x0) {
        local_54 = CURLE_OUT_OF_MEMORY;
        goto LAB_00528b42;
      }
      iVar6 = 0;
      psVar14 = PEM_X509_INFO_read_bio(bp,(stack_st_X509_INFO *)0x0,(undefined1 *)0x0,(void *)0x0);
      if (psVar14 == (stack_st_X509_INFO *)0x0) {
        BIO_free(bp);
        goto LAB_00528b42;
      }
      iVar18 = 0;
      for (; iVar7 = OPENSSL_sk_num(psVar14), iVar6 < iVar7; iVar6 = iVar6 + 1) {
        puVar15 = (undefined8 *)OPENSSL_sk_value(psVar14,iVar6);
        if ((X509 *)*puVar15 != (X509 *)0x0) {
          iVar7 = X509_STORE_add_cert(pXVar11,(X509 *)*puVar15);
          if (iVar7 != 0) {
            iVar18 = iVar18 + 1;
            goto LAB_005288e1;
          }
LAB_00528a00:
          iVar18 = 0;
          break;
        }
LAB_005288e1:
        if ((X509_CRL *)puVar15[1] != (X509_CRL *)0x0) {
          iVar7 = X509_STORE_add_crl(pXVar11,(X509_CRL *)puVar15[1]);
          if (iVar7 == 0) goto LAB_00528a00;
          iVar18 = iVar18 + 1;
        }
      }
      OPENSSL_sk_pop_free(psVar14,X509_INFO_free);
      BIO_free(bp);
      if (iVar18 < 1) goto LAB_00528b42;
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data,"successfully imported CA certificate blob");
      }
    }
    if (pcVar13 == (char *)0x0 && pcVar3 == (char *)0x0) goto LAB_005286c0;
    if ((pcVar13 != (char *)0x0) && (iVar6 = X509_STORE_load_file(pXVar11,pcVar13), iVar6 == 0)) {
      if (pcVar2 == (curl_blob *)0x0) {
        pcVar20 = "error setting certificate file: %s";
        goto LAB_00528bf2;
      }
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data,"error setting certificate file, continuing anyway");
      }
    }
    if ((pcVar3 != (char *)0x0) && (iVar6 = X509_STORE_load_path(pXVar11,pcVar3), iVar6 == 0)) {
      if (pcVar2 == (curl_blob *)0x0) {
        pcVar20 = "error setting certificate path: %s";
        pcVar13 = pcVar3;
LAB_00528bf2:
        Curl_failf(data,pcVar20,pcVar13);
        return CURLE_SSL_CACERT_BADFILE;
      }
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data,"error setting certificate path, continuing anyway");
      }
    }
    if (((data->set).field_0x8bd & 0x10) != 0) {
      if (pcVar13 == (char *)0x0) {
        pcVar13 = "none";
      }
      Curl_infof(data," CAfile: %s",pcVar13);
      if (((data->set).field_0x8bd & 0x10) != 0) {
        pcVar13 = "none";
        if (pcVar3 != (char *)0x0) {
          pcVar13 = pcVar3;
        }
        Curl_infof(data," CApath: %s",pcVar13);
      }
    }
  }
LAB_005286c0:
  if (pcVar20 != (char *)0x0) {
    m = X509_LOOKUP_file();
    ctx = X509_STORE_add_lookup(pXVar11,m);
    if ((ctx == (X509_LOOKUP *)0x0) || (iVar6 = X509_load_crl_file(ctx,pcVar20,1), iVar6 == 0)) {
      Curl_failf(data,"error loading CRL file: %s",pcVar20);
      return CURLE_SSL_CRL_BADFILE;
    }
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"successfully loaded CRL file:");
    }
    X509_STORE_set_flags(pXVar11,0xc);
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"  CRLfile: %s",pcVar20);
    }
  }
  if ((((bVar1 & 1) != 0) && (X509_STORE_set_flags(pXVar11,0x8000), pcVar20 == (char *)0x0)) &&
     ((psVar9->field_0xb0 & 0x10) == 0)) {
    X509_STORE_set_flags(pXVar11,0x80000);
  }
  if (bVar19 == 0) {
    psVar8 = Curl_ssl_cf_get_primary_config(cf);
    pCVar21 = data->multi_easy;
    if ((pCVar21 != (Curl_multi *)0x0) || (pCVar21 = data->multi, pCVar21 != (Curl_multi *)0x0)) {
      pmVar12 = pCVar21->ssl_backend_data;
      if (pmVar12 == (multi_ssl_backend_data *)0x0) {
        pmVar12 = (multi_ssl_backend_data *)(*Curl_ccalloc)(1,0x20);
        pCVar21->ssl_backend_data = pmVar12;
        if (pmVar12 == (multi_ssl_backend_data *)0x0) {
          return CURLE_OK;
        }
      }
      iVar6 = X509_STORE_up_ref(pXVar11);
      if (iVar6 == 0) {
        return CURLE_OK;
      }
      if (psVar8->CAfile == (char *)0x0) {
        pcVar13 = (char *)0x0;
      }
      else {
        pcVar13 = (*Curl_cstrdup)(psVar8->CAfile);
        if (pcVar13 == (char *)0x0) {
          X509_STORE_free(pXVar11);
          return CURLE_OK;
        }
      }
      if ((X509_STORE *)pmVar12->store != (X509_STORE *)0x0) {
        X509_STORE_free((X509_STORE *)pmVar12->store);
        (*Curl_cfree)(pmVar12->CAfile);
      }
      cVar22 = Curl_now();
      (pmVar12->time).tv_sec = cVar22.tv_sec;
      (pmVar12->time).tv_usec = cVar22.tv_usec;
      pmVar12->store = (X509_STORE *)pXVar11;
      pmVar12->CAfile = pcVar13;
    }
    return CURLE_OK;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_ssl_setup_x509_store(struct Curl_cfilter *cf,
                                   struct Curl_easy *data,
                                   SSL_CTX *ssl_ctx)
{
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct ssl_config_data *ssl_config = Curl_ssl_cf_get_config(cf, data);
  CURLcode result = CURLE_OK;
  X509_STORE *cached_store;
  bool cache_criteria_met;

  /* Consider the X509 store cacheable if it comes exclusively from a CAfile,
     or no source is provided and we are falling back to openssl's built-in
     default. */
  cache_criteria_met = (data->set.general_ssl.ca_cache_timeout != 0) &&
    conn_config->verifypeer &&
    !conn_config->CApath &&
    !conn_config->ca_info_blob &&
    !ssl_config->primary.CRLfile &&
    !ssl_config->native_ca_store;

  cached_store = get_cached_x509_store(cf, data);
  if(cached_store && cache_criteria_met && X509_STORE_up_ref(cached_store)) {
    SSL_CTX_set_cert_store(ssl_ctx, cached_store);
  }
  else {
    X509_STORE *store = SSL_CTX_get_cert_store(ssl_ctx);

    result = populate_x509_store(cf, data, store);
    if(result == CURLE_OK && cache_criteria_met) {
      set_cached_x509_store(cf, data, store);
    }
  }

  return result;
}